

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jas_stream.c
# Opt level: O1

long jas_stream_tell(jas_stream_t *stream)

{
  int iVar1;
  int iVar2;
  long lVar3;
  
  iVar1 = jas_getdbglevel();
  if (99 < iVar1) {
    jas_eprintf("jas_stream_tell(%p)\n",stream);
  }
  iVar1 = 0;
  if ((stream->bufmode_ & 0x10U) == 0) {
    if ((stream->bufmode_ & 0x20U) != 0) {
      iVar1 = *(int *)&stream->ptr_ - *(int *)&stream->bufstart_;
    }
  }
  else {
    iVar1 = -stream->cnt_;
  }
  lVar3 = (*stream->ops_->seek_)(stream->obj_,0,1);
  iVar2 = -1;
  if (-1 < (int)lVar3) {
    iVar2 = iVar1 + (int)lVar3;
  }
  return (long)iVar2;
}

Assistant:

long jas_stream_tell(jas_stream_t *stream)
{
	int adjust;
	int offset;

	JAS_DBGLOG(100, ("jas_stream_tell(%p)\n", stream));

	if (stream->bufmode_ & JAS_STREAM_RDBUF) {
		adjust = -stream->cnt_;
	} else if (stream->bufmode_ & JAS_STREAM_WRBUF) {
		adjust = stream->ptr_ - stream->bufstart_;
	} else {
		adjust = 0;
	}

	if ((offset = (*stream->ops_->seek_)(stream->obj_, 0, SEEK_CUR)) < 0) {
		return -1;
	}

	return offset + adjust;
}